

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O0

void __thiscall
wasm::anon_unknown_227::ConstantFieldPropagation::run(ConstantFieldPropagation *this,Module *module)

{
  __node_base_ptr *this_00;
  bool bVar1;
  PassRunner *runner_00;
  FunctionOptimizer local_3c8;
  undefined1 local_2b0 [8];
  PCVStructValuesMap combinedInfos;
  TypeHierarchyPropagator<wasm::PossibleConstantValues> propagator;
  PCVStructValuesMap combinedSetInfos;
  PCVStructValuesMap combinedNewInfos;
  PassRunner *runner;
  PCVScanner scanner;
  undefined1 local_88 [8];
  PCVFunctionStructValuesMap functionSetInfos;
  PCVFunctionStructValuesMap functionNewInfos;
  Module *module_local;
  ConstantFieldPropagation *this_local;
  
  bVar1 = FeatureSet::hasGC(&module->features);
  if (bVar1) {
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,module);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_88,module);
    PCVScanner::PCVScanner
              ((PCVScanner *)&runner,
               (FunctionStructValuesMap<wasm::PossibleConstantValues> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,
               (FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_88);
    runner_00 = Pass::getPassRunner(&this->super_Pass);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    ::run((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           *)&runner,runner_00,module);
    WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
    ::runOnModuleCode((WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                       *)&runner,runner_00,module);
    this_00 = &combinedSetInfos.
               super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
               ._M_h._M_single_bucket;
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)this_00);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::combineInto
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,(StructValuesMap<wasm::PossibleConstantValues> *)this_00);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::combineInto
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_88,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,module);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::propagateToSuperTypes
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedSetInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::propagateToSuperAndSubTypes
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)local_2b0,
               (StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedSetInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::combineInto
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket,
               (StructValuesMap<wasm::PossibleConstantValues> *)local_2b0);
    FunctionOptimizer::FunctionOptimizer(&local_3c8,(PCVStructValuesMap *)local_2b0);
    WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
    ::run(&local_3c8.
           super_WalkerPass<wasm::PostWalker<wasm::(anonymous_namespace)::FunctionOptimizer,_wasm::Visitor<wasm::(anonymous_namespace)::FunctionOptimizer,_void>_>_>
          ,runner_00,module);
    FunctionOptimizer::~FunctionOptimizer(&local_3c8);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::~StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)local_2b0);
    StructUtils::TypeHierarchyPropagator<wasm::PossibleConstantValues>::~TypeHierarchyPropagator
              ((TypeHierarchyPropagator<wasm::PossibleConstantValues> *)
               &combinedInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::~StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &propagator.subTypes.typeSubTypes._M_h._M_single_bucket);
    StructUtils::StructValuesMap<wasm::PossibleConstantValues>::~StructValuesMap
              ((StructValuesMap<wasm::PossibleConstantValues> *)
               &combinedSetInfos.
                super_unordered_map<wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
    PCVScanner::~PCVScanner((PCVScanner *)&runner);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)local_88);
    StructUtils::FunctionStructValuesMap<wasm::PossibleConstantValues>::~FunctionStructValuesMap
              ((FunctionStructValuesMap<wasm::PossibleConstantValues> *)
               &functionSetInfos.
                super_unordered_map<wasm::Function_*,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>,_std::hash<wasm::Function_*>,_std::equal_to<wasm::Function_*>,_std::allocator<std::pair<wasm::Function_*const,_wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>_>_>_>
                ._M_h._M_single_bucket);
  }
  return;
}

Assistant:

void run(Module* module) override {
    if (!module->features.hasGC()) {
      return;
    }

    // Find and analyze all writes inside each function.
    PCVFunctionStructValuesMap functionNewInfos(*module),
      functionSetInfos(*module);
    PCVScanner scanner(functionNewInfos, functionSetInfos);
    auto* runner = getPassRunner();
    scanner.run(runner, module);
    scanner.runOnModuleCode(runner, module);

    // Combine the data from the functions.
    PCVStructValuesMap combinedNewInfos, combinedSetInfos;
    functionNewInfos.combineInto(combinedNewInfos);
    functionSetInfos.combineInto(combinedSetInfos);

    // Handle subtyping. |combinedInfo| so far contains data that represents
    // each struct.new and struct.set's operation on the struct type used in
    // that instruction. That is, if we do a struct.set to type T, the value was
    // noted for type T. But our actual goal is to answer questions about
    // struct.gets. Specifically, when later we see:
    //
    //  (struct.get $A x (REF-1))
    //
    // Then we want to be aware of all the relevant struct.sets, that is, the
    // sets that can write data that this get reads. Given a set
    //
    //  (struct.set $B x (REF-2) (..value..))
    //
    // then
    //
    //  1. If $B is a subtype of $A, it is relevant: the get might read from a
    //     struct of type $B (i.e., REF-1 and REF-2 might be identical, and both
    //     be a struct of type $B).
    //  2. If $B is a supertype of $A that still has the field x then it may
    //     also be relevant: since $A is a subtype of $B, the set may write to a
    //     struct of type $A (and again, REF-1 and REF-2 may be identical).
    //
    // Thus, if either $A <: $B or $B <: $A then we must consider the get and
    // set to be relevant to each other. To make our later lookups for gets
    // efficient, we therefore propagate information about the possible values
    // in each field to both subtypes and supertypes.
    //
    // struct.new on the other hand knows exactly what type is being written to,
    // and so given a get of $A and a new of $B, the new is relevant for the get
    // iff $A is a subtype of $B, so we only need to propagate in one direction
    // there, to supertypes.

    StructUtils::TypeHierarchyPropagator<PossibleConstantValues> propagator(
      *module);
    propagator.propagateToSuperTypes(combinedNewInfos);
    propagator.propagateToSuperAndSubTypes(combinedSetInfos);

    // Combine both sources of information to the final information that gets
    // care about.
    PCVStructValuesMap combinedInfos = std::move(combinedNewInfos);
    combinedSetInfos.combineInto(combinedInfos);

    // Optimize.
    // TODO: Skip this if we cannot optimize anything
    FunctionOptimizer(combinedInfos).run(runner, module);

    // TODO: Actually remove the field from the type, where possible? That might
    //       be best in another pass.
  }